

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QMainWindowLayout::insertToolBarBreak(QMainWindowLayout *this,QToolBar *before)

{
  bool bVar1;
  QToolBar *in_RDI;
  QToolBarAreaLayout *unaff_retaddr;
  QToolBar *before_00;
  
  before_00 = in_RDI;
  QToolBarAreaLayout::insertToolBarBreak(unaff_retaddr,in_RDI);
  bVar1 = QMainWindowLayoutState::isValid((QMainWindowLayoutState *)0x5f5f20);
  if (bVar1) {
    QToolBarAreaLayout::insertToolBarBreak(unaff_retaddr,before_00);
  }
  (**(code **)(*(long *)&in_RDI->super_QWidget + 0x70))();
  return;
}

Assistant:

void QMainWindowLayout::insertToolBarBreak(QToolBar *before)
{
    layoutState.toolBarAreaLayout.insertToolBarBreak(before);
    if (savedState.isValid())
        savedState.toolBarAreaLayout.insertToolBarBreak(before);
    invalidate();
}